

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

SyntaxKind slang::syntax::SyntaxFacts::getKeywordNameExpression(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (iVar1 < 299) {
    if (iVar1 < 0xde) {
      if (iVar1 == 100) {
        return ArrayAndMethod;
      }
      if (iVar1 == 0xd2) {
        return LocalScope;
      }
    }
    else {
      if (iVar1 == 0xde) {
        return ConstructorName;
      }
      if (iVar1 == 0xe7) {
        return ArrayOrMethod;
      }
      if (iVar1 == 0x123) {
        return SuperHandle;
      }
    }
  }
  else if (iVar1 < 0x155) {
    if (iVar1 == 299) {
      return ThisHandle;
    }
    if (iVar1 == 0x13c) {
      return ArrayUniqueMethod;
    }
  }
  else {
    if (iVar1 == 0x155) {
      return ArrayXorMethod;
    }
    if (iVar1 == 0x156) {
      return UnitScope;
    }
    if (iVar1 == 0x157) {
      return RootScope;
    }
  }
  return Unknown;
}

Assistant:

SyntaxKind SyntaxFacts::getKeywordNameExpression(TokenKind kind) {
    switch (kind) {
        case TokenKind::UnitSystemName: return SyntaxKind::UnitScope;
        case TokenKind::RootSystemName: return SyntaxKind::RootScope;
        case TokenKind::LocalKeyword: return SyntaxKind::LocalScope;
        case TokenKind::ThisKeyword: return SyntaxKind::ThisHandle;
        case TokenKind::SuperKeyword: return SyntaxKind::SuperHandle;
        case TokenKind::UniqueKeyword: return SyntaxKind::ArrayUniqueMethod;
        case TokenKind::AndKeyword: return SyntaxKind::ArrayAndMethod;
        case TokenKind::OrKeyword: return SyntaxKind::ArrayOrMethod;
        case TokenKind::XorKeyword: return SyntaxKind::ArrayXorMethod;
        case TokenKind::NewKeyword: return SyntaxKind::ConstructorName;
        default: return SyntaxKind::Unknown;
    }
}